

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::~IsoWriter(IsoWriter *this)

{
  FileEntryInfo *pFVar1;
  int in_ESI;
  IsoWriter *this_local;
  
  close(this,in_ESI);
  pFVar1 = this->m_rootDirInfo;
  if (pFVar1 != (FileEntryInfo *)0x0) {
    FileEntryInfo::~FileEntryInfo(pFVar1);
    operator_delete(pFVar1,0xa8);
  }
  pFVar1 = this->m_systemStreamDir;
  if (pFVar1 != (FileEntryInfo *)0x0) {
    FileEntryInfo::~FileEntryInfo(pFVar1);
    operator_delete(pFVar1,0xa8);
  }
  std::map<int,_MappingEntry,_std::less<int>,_std::allocator<std::pair<const_int,_MappingEntry>_>_>
  ::~map(&this->m_mappingEntries);
  File::~File(&this->m_file);
  std::__cxx11::string::~string((string *)&this->m_appId);
  std::__cxx11::string::~string((string *)&this->m_impId);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

IsoWriter::~IsoWriter()
{
    close();
    delete m_rootDirInfo;
    delete m_systemStreamDir;
}